

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestNoSuchTest::Run(TestNoSuchTest *this)

{
  Results rs;
  TestRegistry r;
  allocator local_14a9;
  string local_14a8;
  Results local_1488;
  RunParams local_1470;
  TestRegistry local_1458;
  
  testinator::TestRegistry::TestRegistry(&local_1458);
  std::__cxx11::string::string((string *)&local_14a8,"A",&local_14a9);
  local_1470.m_flags = 0;
  local_1470._4_4_ = 0;
  local_1470.m_numPropertyChecks = 100;
  local_1470.m_randomSeed = 0;
  testinator::TestRegistry::RunTest
            (&local_1488,&local_1458,&local_14a8,&local_1470,(Outputter *)0x0);
  std::__cxx11::string::~string((string *)&local_14a8);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_1488);
  testinator::TestRegistry::~TestRegistry(&local_1458);
  return local_1488.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_1488.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    testinator::Results rs = r.RunTest("A");
    return rs.empty();
  }